

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  Message *pMVar1;
  undefined7 in_register_00000011;
  Int32 total_shards;
  Message msg;
  Int32 shard_index;
  uint local_4c;
  Message local_48;
  uint local_3c;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) != 0) {
    return false;
  }
  local_4c = Int32FromEnvOrDie(total_shards_env,-1);
  local_3c = Int32FromEnvOrDie(shard_index_env,-1);
  if ((local_4c & local_3c) == 0xffffffff) {
    return false;
  }
  if (local_3c == 0xffffffff || local_4c != 0xffffffff) {
    if (local_4c == 0xffffffff || local_3c != 0xffffffff) {
      if ((-1 < (int)local_3c) && ((int)local_3c < (int)local_4c)) {
        return 1 < (int)local_4c;
      }
      Message::Message((Message *)&local_38);
      pMVar1 = Message::operator<<((Message *)&local_38,
                                   (char (*) [48])"Invalid environment variables: we require 0 <= ")
      ;
      pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [4])" < ");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [16])", but you have ");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x27fcb2);
      pMVar1 = Message::operator<<(pMVar1,(int *)&local_3c);
      pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x284c9d);
      pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x27fcb2);
      pMVar1 = Message::operator<<(pMVar1,(int *)&local_4c);
      pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x2834ce);
      goto LAB_00206d19;
    }
    Message::Message((Message *)&local_38);
    pMVar1 = Message::operator<<((Message *)&local_38,
                                 (char (*) [41])"Invalid environment variables: you have ");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x283bfa);
    pMVar1 = Message::operator<<(pMVar1,(int *)&local_4c);
    pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
  }
  else {
    Message::Message((Message *)&local_38);
    pMVar1 = Message::operator<<((Message *)&local_38,
                                 (char (*) [41])"Invalid environment variables: you have ");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x283bfa);
    pMVar1 = Message::operator<<(pMVar1,(int *)&local_3c);
    pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
  }
  pMVar1 = Message::operator<<(pMVar1,(char (*) [9])" unset.\n");
LAB_00206d19:
  Message::Message(&local_48,pMVar1);
  if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    local_38._M_dataplus._M_p = (pointer)0x0;
  }
  Message::GetString_abi_cxx11_(&local_38,&local_48);
  ColoredPrintf(COLOR_RED,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  fflush(_stdout);
  exit(1);
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}